

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_context_uninit(ma_context *pContext)

{
  _func_ma_result_ma_context_ptr *p_Var1;
  _func_void_void_ptr_void_ptr *p_Var2;
  ma_result mVar3;
  
  if (pContext == (ma_context *)0x0) {
    mVar3 = MA_INVALID_ARGS;
  }
  else {
    p_Var1 = (pContext->callbacks).onContextUninit;
    if (p_Var1 != (_func_ma_result_ma_context_ptr *)0x0) {
      (*p_Var1)(pContext);
    }
    pthread_mutex_destroy((pthread_mutex_t *)&pContext->deviceEnumLock);
    pthread_mutex_destroy((pthread_mutex_t *)&pContext->deviceInfoLock);
    if ((pContext->pDeviceInfos != (ma_device_info *)0x0) &&
       (p_Var2 = (pContext->allocationCallbacks).onFree,
       p_Var2 != (_func_void_void_ptr_void_ptr *)0x0)) {
      (*p_Var2)(pContext->pDeviceInfos,(pContext->allocationCallbacks).pUserData);
    }
    mVar3 = MA_SUCCESS;
    if (pContext->pLog == &pContext->log) {
      pthread_mutex_destroy((pthread_mutex_t *)&(pContext->log).lock);
      mVar3 = MA_SUCCESS;
    }
  }
  return mVar3;
}

Assistant:

MA_API ma_result ma_context_uninit(ma_context* pContext)
{
    if (pContext == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pContext->callbacks.onContextUninit != NULL) {
        pContext->callbacks.onContextUninit(pContext);
    }

    ma_mutex_uninit(&pContext->deviceEnumLock);
    ma_mutex_uninit(&pContext->deviceInfoLock);
    ma_free(pContext->pDeviceInfos, &pContext->allocationCallbacks);
    ma_context_uninit_backend_apis(pContext);

    if (pContext->pLog == &pContext->log) {
        ma_log_uninit(&pContext->log);
    }

    return MA_SUCCESS;
}